

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QTableWidgetSelectionRange>::reallocateAndGrow
          (QArrayDataPointer<QTableWidgetSelectionRange> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTableWidgetSelectionRange> *old)

{
  QTableWidgetSelectionRange *pQVar1;
  QArrayData *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QTableWidgetSelectionRange *pQVar7;
  QTableWidgetSelectionRange *pQVar8;
  qsizetype qVar9;
  long lVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  QArrayDataPointer<QTableWidgetSelectionRange> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QTableWidgetSelectionRange> *)0x0 && where == GrowsAtEnd) {
    pQVar2 = &this->d->super_QArrayData;
    if (pQVar2 == (QArrayData *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar3)) {
      if (pQVar2 == (QArrayData *)0x0) {
        qVar9 = 0;
        lVar10 = 0;
      }
      else {
        qVar9 = pQVar2->alloc;
        lVar10 = (this->size - pQVar2->alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4);
      }
      auVar11 = QArrayData::reallocateUnaligned(pQVar2,this->ptr,0x10,qVar9 + n + lVar10,Grow);
      this->d = (Data *)auVar11._0_8_;
      this->ptr = (QTableWidgetSelectionRange *)auVar11._8_8_;
      goto LAB_005a71ec;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QTableWidgetSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar10 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pQVar7 = this->ptr;
    pQVar8 = pQVar7 + lVar10;
    if ((old != (QArrayDataPointer<QTableWidgetSelectionRange> *)0x0) || (bVar3)) {
      if ((lVar10 != 0) && (0 < lVar10)) {
        do {
          iVar4 = pQVar7->m_left;
          iVar5 = pQVar7->m_bottom;
          iVar6 = pQVar7->m_right;
          pQVar1 = local_38.ptr + local_38.size;
          pQVar1->m_top = pQVar7->m_top;
          pQVar1->m_left = iVar4;
          pQVar1->m_bottom = iVar5;
          pQVar1->m_right = iVar6;
          pQVar7 = pQVar7 + 1;
          local_38.size = local_38.size + 1;
        } while (pQVar7 < pQVar8);
      }
    }
    else if ((lVar10 != 0) && (0 < lVar10)) {
      do {
        iVar4 = pQVar7->m_left;
        iVar5 = pQVar7->m_bottom;
        iVar6 = pQVar7->m_right;
        pQVar1 = local_38.ptr + local_38.size;
        pQVar1->m_top = pQVar7->m_top;
        pQVar1->m_left = iVar4;
        pQVar1->m_bottom = iVar5;
        pQVar1->m_right = iVar6;
        pQVar7 = pQVar7 + 1;
        local_38.size = local_38.size + 1;
      } while (pQVar7 < pQVar8);
    }
  }
  pQVar2 = &this->d->super_QArrayData;
  pQVar7 = this->ptr;
  *(undefined4 *)&this->d = local_38.d._0_4_;
  *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
  *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
  *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
  qVar9 = this->size;
  this->size = local_38.size;
  local_38.d = (Data *)pQVar2;
  local_38.ptr = pQVar7;
  local_38.size = qVar9;
  if (old != (QArrayDataPointer<QTableWidgetSelectionRange> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = (Data *)pQVar2;
    old->ptr = pQVar7;
    local_38.size = old->size;
    old->size = qVar9;
  }
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x10,0x10);
    }
  }
LAB_005a71ec:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }